

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::DividedByEqual<short,short>,short,std::allocator<unsigned_long>>
               (View<short,_false,_std::allocator<unsigned_long>_> *v,short *x)

{
  bool bVar1;
  reference psVar2;
  size_t sVar3;
  reference psVar4;
  size_t j;
  size_t sVar5;
  iterator it;
  iterator iStack_48;
  
  bVar1 = View<short,_false,_std::allocator<unsigned_long>_>::isSimple(v);
  if (bVar1) {
    psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                       ((View<short,false,std::allocator<unsigned_long>> *)v,0);
    sVar3 = (v->geometry_).size_;
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      psVar2[sVar5] = psVar2[sVar5] / *x;
    }
  }
  else {
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::DividedByEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
      return;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::begin(&iStack_48,v);
    while( true ) {
      bVar1 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore(&iStack_48);
      if (!bVar1) break;
      psVar4 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*(&iStack_48);
      *psVar4 = *psVar4 / *x;
      Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++(&iStack_48);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&iStack_48.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    const T& x, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j], x);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperBinaryScalar<1, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperBinaryScalar<2, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperBinaryScalar<3, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperBinaryScalar<4, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperBinaryScalar<5, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperBinaryScalar<6, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperBinaryScalar<7, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperBinaryScalar<8, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperBinaryScalar<9, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperBinaryScalar<10, Functor, T, T, A>::operate(v, x, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it, x); 
        }
    }
}